

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Plugin_TeeBee.cpp
# Opt level: O2

int TeeBee::ReleaseCallback(UnityAudioEffectState *state)

{
  EffectData *pEVar1;
  
  pEVar1 = UnityAudioEffectState::GetEffectData<TeeBee::EffectData>(state);
  operator_delete(pEVar1,0x170);
  return 0;
}

Assistant:

UNITY_AUDIODSP_RESULT UNITY_AUDIODSP_CALLBACK ReleaseCallback(UnityAudioEffectState* state)
    {
        EffectData::Data* data = &state->GetEffectData<EffectData>()->data;
        delete data;
        return UNITY_AUDIODSP_OK;
    }